

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type,bool skip_cast_if_equal_type,bool implicit_integer_promotion)

{
  BaseType BVar1;
  bool bVar2;
  SPIRType *pSVar3;
  string *ts_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  undefined1 local_24a [2];
  spirv_cross local_248 [32];
  char *op_local;
  string expr;
  string bitop;
  string cast_op1;
  string cast_op0;
  string local_1a0;
  SPIRType expected_type;
  
  cast_op0._M_dataplus._M_p = (pointer)&cast_op0.field_2;
  cast_op0._M_string_length = 0;
  cast_op0.field_2._M_local_buf[0] = '\0';
  cast_op1._M_dataplus._M_p = (pointer)&cast_op1.field_2;
  cast_op1._M_string_length = 0;
  cast_op1.field_2._M_local_buf[0] = '\0';
  op_local = op;
  binary_op_bitcast_helper
            (&expected_type,this,&cast_op0,&cast_op1,&input_type,op0,op1,skip_cast_if_equal_type);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  ts_3 = &cast_op1;
  join<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&>
            (&bitop,(spirv_cross *)&cast_op0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
             (char (*) [2])&op_local,(char **)0x37fb8c,(char (*) [2])ts_3,in_stack_fffffffffffffda8)
  ;
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  if (implicit_integer_promotion == false) {
    BVar1 = *(BaseType *)&(pSVar3->super_IVariant).field_0xc;
    if (BVar1 == Boolean || BVar1 == input_type) {
      ::std::__cxx11::string::operator=((string *)&expr,(string *)&bitop);
      goto LAB_002575fb;
    }
    expected_type.super_IVariant._12_4_ = input_type;
    (*(this->super_Compiler)._vptr_Compiler[0x38])(local_248,this,pSVar3);
    local_24a[1] = 0x28;
    local_24a[0] = 0x29;
    join<std::__cxx11::string,char,std::__cxx11::string&,char>
              (&local_1a0,local_248,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_24a + 1),
               (char *)&bitop,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_24a,
               (char *)ts_3);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_248,this,pSVar3,0);
    local_24a[1] = 0x28;
    local_24a[0] = 0x29;
    join<std::__cxx11::string,char,std::__cxx11::string&,char>
              (&local_1a0,local_248,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_24a + 1),
               (char *)&bitop,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_24a,
               (char *)ts_3);
  }
  ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_1a0);
  ::std::__cxx11::string::~string((string *)&local_1a0);
  ::std::__cxx11::string::~string((string *)local_248);
LAB_002575fb:
  bVar2 = should_forward(this,op0);
  if (bVar2) {
    bVar2 = should_forward(this,op1);
  }
  else {
    bVar2 = false;
  }
  emit_op(this,result_type,result_id,&expr,bVar2,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  ::std::__cxx11::string::~string((string *)&expr);
  ::std::__cxx11::string::~string((string *)&bitop);
  SPIRType::~SPIRType(&expected_type);
  ::std::__cxx11::string::~string((string *)&cast_op1);
  ::std::__cxx11::string::~string((string *)&cast_op0);
  return;
}

Assistant:

void CompilerGLSL::emit_binary_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op, SPIRType::BaseType input_type,
                                       bool skip_cast_if_equal_type,
                                       bool implicit_integer_promotion)
{
	string cast_op0, cast_op1;
	auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, op0, op1, skip_cast_if_equal_type);
	auto &out_type = get<SPIRType>(result_type);

	// We might have casted away from the result type, so bitcast again.
	// For example, arithmetic right shift with uint inputs.
	// Special case boolean outputs since relational opcodes output booleans instead of int/uint.
	auto bitop = join(cast_op0, " ", op, " ", cast_op1);
	string expr;

	if (implicit_integer_promotion)
	{
		// Simple value cast.
		expr = join(type_to_glsl(out_type), '(', bitop, ')');
	}
	else if (out_type.basetype != input_type && out_type.basetype != SPIRType::Boolean)
	{
		expected_type.basetype = input_type;
		expr = join(bitcast_glsl_op(out_type, expected_type), '(', bitop, ')');
	}
	else
	{
		expr = std::move(bitop);
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}